

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetShortPathToFile_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this,char *cfname)

{
  ulong uVar1;
  ulong uVar2;
  char *in_RCX;
  string *path;
  string srcRelpath;
  string fname;
  string bldRelpath;
  string sStack_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_c8,"SourceDirectory",(allocator *)&sStack_e8);
  GetCTestConfiguration(&local_a8,this,&local_c8);
  cmsys::SystemTools::CollapseFullPath(&local_48,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&sStack_e8,"BuildDirectory",(allocator *)&local_88);
  GetCTestConfiguration(&local_c8,this,&sStack_e8);
  cmsys::SystemTools::CollapseFullPath(&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string((string *)&sStack_e8,cfname,(allocator *)&local_88);
  cmsys::SystemTools::CollapseFullPath(&local_c8,&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  cmSystemTools::RelativePath_abi_cxx11_
            (&sStack_e8,(cmSystemTools *)local_48._M_dataplus._M_p,local_c8._M_dataplus._M_p,in_RCX)
  ;
  cmSystemTools::RelativePath_abi_cxx11_
            (&local_88,(cmSystemTools *)local_a8._M_dataplus._M_p,local_c8._M_dataplus._M_p,in_RCX);
  uVar1 = std::__cxx11::string::find((char *)&sStack_e8,0x54e6ee);
  uVar2 = std::__cxx11::string::find((char *)&local_88,0x54e6ee);
  if ((uVar2 & uVar1) == 0xffffffffffffffff) {
    path = &local_88;
    if (sStack_e8._M_string_length < local_88._M_string_length) {
      path = &sStack_e8;
    }
  }
  else {
    path = (string *)0x0;
    if (uVar2 == 0xffffffffffffffff) {
      path = &local_88;
    }
    if (uVar1 == 0xffffffffffffffff) {
      path = &sStack_e8;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (path == (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    std::operator+(&local_68,"./",path);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        '/') {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","_");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","_");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetShortPathToFile(const char* cfname)
{
  const std::string& sourceDir
    = cmSystemTools::CollapseFullPath(
        this->GetCTestConfiguration("SourceDirectory"));
  const std::string& buildDir
    = cmSystemTools::CollapseFullPath(
        this->GetCTestConfiguration("BuildDirectory"));
  std::string fname = cmSystemTools::CollapseFullPath(cfname);

  // Find relative paths to both directories
  std::string srcRelpath
    = cmSystemTools::RelativePath(sourceDir.c_str(), fname.c_str());
  std::string bldRelpath
    = cmSystemTools::RelativePath(buildDir.c_str(), fname.c_str());

  // If any contains "." it is not parent directory
  bool inSrc = srcRelpath.find("..") == srcRelpath.npos;
  bool inBld = bldRelpath.find("..") == bldRelpath.npos;
  // TODO: Handle files with .. in their name

  std::string* res = 0;

  if ( inSrc && inBld )
    {
    // If both have relative path with no dots, pick the shorter one
    if ( srcRelpath.size() < bldRelpath.size() )
      {
      res = &srcRelpath;
      }
    else
      {
      res = &bldRelpath;
      }
    }
  else if ( inSrc )
    {
    res = &srcRelpath;
    }
  else if ( inBld )
    {
    res = &bldRelpath;
    }

  std::string path;

  if ( !res )
    {
    path = fname;
    }
  else
    {
    cmSystemTools::ConvertToUnixSlashes(*res);

    path = "./" + *res;
    if ( path[path.size()-1] == '/' )
      {
      path = path.substr(0, path.size()-1);
      }
    }

  cmsys::SystemTools::ReplaceString(path, ":", "_");
  cmsys::SystemTools::ReplaceString(path, " ", "_");
  return path;
}